

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

double __thiscall
chrono::ChOptimizerGenetic::ComputeFitness(ChOptimizerGenetic *this,ChGenotype *mygen)

{
  ulong uVar1;
  uint uVar2;
  double *x;
  ulong uVar3;
  double dVar4;
  
  uVar2 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  x = (double *)calloc((long)(int)uVar2,8);
  if (0 < (int)uVar2) {
    uVar1 = (mygen->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    uVar3 = 0;
    do {
      if ((~((long)uVar1 >> 0x3f) & uVar1) == uVar3) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      x[uVar3] = (mygen->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  dVar4 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,x);
  mygen->fitness = dVar4;
  mygen->need_eval = false;
  free(x);
  return dVar4;
}

Assistant:

double ChOptimizerGenetic::ComputeFitness(ChGenotype* mygen) {
    int nv = GetNumOfVars();
    int mvar;
    double mfitness = 0;
    // create temporary array of variables for function-parameter-passing purposes.
    double* myvars = (double*)calloc(nv, sizeof(double));

    // fill the vector of variables as double* array
    for (mvar = 0; mvar < nv; mvar++) {
        myvars[mvar] = mygen->genes(mvar);
    }

    // impose these variables to the system,
    //  Vars_to_System(myvars);
    // evaluate functional,
    mfitness = Eval_fx(myvars);  // ++++++ HERE THE FITNESS IS EVALUATED

    mygen->fitness = mfitness;
    // set flag for speed reasons..
    mygen->need_eval = false;

    free(myvars);  // delete the array of variables

    return mfitness;
}